

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O1

void __thiscall xercesc_4_0::XMLUri::buildFullText(XMLUri *this)

{
  short *psVar1;
  XMLCh *pXVar2;
  XMLCh *src;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  XMLCh *pXVar10;
  XMLCh *target;
  XMLCh tmpBuf [17];
  XMLCh local_48 [20];
  
  if (this->fScheme == (XMLCh *)0x0) {
    lVar4 = 5;
  }
  else {
    lVar4 = 0;
    do {
      psVar1 = (short *)((long)this->fScheme + lVar4);
      lVar4 = lVar4 + 2;
    } while (*psVar1 != 0);
    lVar4 = (lVar4 >> 1) + 4;
  }
  lVar5 = 0;
  if (this->fFragment != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)this->fFragment + lVar5);
      lVar5 = lVar5 + 2;
    } while (*psVar1 != 0);
    lVar5 = (lVar5 >> 1) + -1;
  }
  pXVar10 = this->fHost;
  if (pXVar10 == (XMLCh *)0x0) {
    pXVar10 = this->fRegAuth;
  }
  lVar9 = 0;
  if (pXVar10 != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)pXVar10 + lVar9);
      lVar9 = lVar9 + 2;
    } while (*psVar1 != 0);
    lVar9 = (lVar9 >> 1) + -1;
  }
  lVar6 = 0;
  if (this->fPath != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)this->fPath + lVar6);
      lVar6 = lVar6 + 2;
    } while (*psVar1 != 0);
    lVar6 = (lVar6 >> 1) + -1;
  }
  lVar7 = 0;
  if (this->fQueryString != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)this->fQueryString + lVar7);
      lVar7 = lVar7 + 2;
    } while (*psVar1 != 0);
    lVar7 = (lVar7 >> 1) + -1;
  }
  lVar8 = 0;
  if (this->fUserInfo != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)this->fUserInfo + lVar8);
      lVar8 = lVar8 + 2;
    } while (*psVar1 != 0);
    lVar8 = (lVar8 >> 1) + -1;
  }
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fURIText);
  iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                    (this->fMemoryManager,(lVar9 + lVar6 + lVar4 + lVar5 + lVar7 + lVar8) * 2 + 0x42
                    );
  pXVar10 = (XMLCh *)CONCAT44(extraout_var,iVar3);
  this->fURIText = pXVar10;
  *pXVar10 = L'\0';
  if (this->fScheme != (XMLCh *)0x0) {
    XMLString::catString(pXVar10,this->fScheme);
    lVar4 = 0;
    if (this->fURIText != (XMLCh *)0x0) {
      do {
        psVar1 = (short *)((long)this->fURIText + lVar4);
        lVar4 = lVar4 + 2;
      } while (*psVar1 != 0);
      lVar4 = (lVar4 >> 1) + -1;
    }
    pXVar10[lVar4] = L':';
    pXVar10 = pXVar10 + lVar4 + 1;
  }
  pXVar2 = this->fHost;
  src = this->fRegAuth;
  if (pXVar2 != (XMLCh *)0x0 || src != (XMLCh *)0x0) {
    target = pXVar10 + 2;
    pXVar10[0] = L'/';
    pXVar10[1] = L'/';
    if (pXVar2 == (XMLCh *)0x0) {
      XMLString::copyString(target,src);
      lVar4 = 0;
      if (this->fRegAuth != (XMLCh *)0x0) {
        do {
          psVar1 = (short *)((long)this->fRegAuth + lVar4);
          lVar4 = lVar4 + 2;
        } while (*psVar1 != 0);
        lVar4 = (lVar4 >> 1) + -1;
      }
      pXVar10 = target + lVar4;
    }
    else {
      if (this->fUserInfo != (XMLCh *)0x0) {
        XMLString::copyString(target,this->fUserInfo);
        lVar4 = 0;
        if (this->fUserInfo != (XMLCh *)0x0) {
          do {
            psVar1 = (short *)((long)this->fUserInfo + lVar4);
            lVar4 = lVar4 + 2;
          } while (*psVar1 != 0);
          lVar4 = (lVar4 >> 1) + -1;
        }
        pXVar10 = target + lVar4;
        target = pXVar10 + 1;
        *pXVar10 = L'@';
      }
      XMLString::copyString(target,this->fHost);
      lVar4 = 0;
      if (this->fHost != (XMLCh *)0x0) {
        do {
          psVar1 = (short *)((long)this->fHost + lVar4);
          lVar4 = lVar4 + 2;
        } while (*psVar1 != 0);
        lVar4 = (lVar4 >> 1) + -1;
      }
      pXVar10 = target + lVar4;
      iVar3 = this->fPort;
      if (iVar3 != -1) {
        *pXVar10 = L':';
        XMLString::binToText(iVar3,local_48,0x10,10,this->fMemoryManager);
        XMLString::copyString(pXVar10 + 1,local_48);
        lVar4 = 0;
        do {
          psVar1 = (short *)((long)local_48 + lVar4);
          lVar4 = lVar4 + 2;
        } while (*psVar1 != 0);
        pXVar10 = (XMLCh *)((long)pXVar10 + lVar4);
      }
    }
  }
  if (this->fPath != (XMLCh *)0x0) {
    XMLString::copyString(pXVar10,this->fPath);
    lVar4 = 0;
    if (this->fPath != (XMLCh *)0x0) {
      do {
        psVar1 = (short *)((long)this->fPath + lVar4);
        lVar4 = lVar4 + 2;
      } while (*psVar1 != 0);
      lVar4 = (lVar4 >> 1) + -1;
    }
    pXVar10 = pXVar10 + lVar4;
  }
  pXVar2 = this->fQueryString;
  if (pXVar2 != (XMLCh *)0x0) {
    *pXVar10 = L'?';
    XMLString::copyString(pXVar10 + 1,pXVar2);
    lVar4 = 0;
    if (this->fQueryString != (XMLCh *)0x0) {
      do {
        psVar1 = (short *)((long)this->fQueryString + lVar4);
        lVar4 = lVar4 + 2;
      } while (*psVar1 != 0);
      lVar4 = (lVar4 >> 1) + -1;
    }
    pXVar10 = pXVar10 + 1 + lVar4;
  }
  pXVar2 = this->fFragment;
  if (pXVar2 != (XMLCh *)0x0) {
    *pXVar10 = L'#';
    XMLString::copyString(pXVar10 + 1,pXVar2);
    lVar4 = 0;
    if (this->fFragment != (XMLCh *)0x0) {
      do {
        psVar1 = (short *)((long)this->fFragment + lVar4);
        lVar4 = lVar4 + 2;
      } while (*psVar1 != 0);
      lVar4 = (lVar4 >> 1) + -1;
    }
    pXVar10 = pXVar10 + 1 + lVar4;
  }
  *pXVar10 = L'\0';
  return;
}

Assistant:

void XMLUri::buildFullText()
{
    // Calculate the worst case size of the buffer required
    XMLSize_t bufSize = XMLString::stringLen(fScheme) + 1
                           + XMLString::stringLen(fFragment) + 1
                           + XMLString::stringLen(fHost ? fHost : fRegAuth) + 2
                           + XMLString::stringLen(fPath)
                           + XMLString::stringLen(fQueryString) + 1
                           + XMLString::stringLen(fUserInfo) + 1
                           + 32;

    // Clean up the existing buffer and allocate another
    fMemoryManager->deallocate(fURIText);//delete [] fURIText;
    fURIText = (XMLCh*) fMemoryManager->allocate(bufSize * sizeof(XMLCh));//new XMLCh[bufSize];
    *fURIText = 0;

    XMLCh* outPtr = fURIText;
    if (fScheme != 0)
    {
        XMLString::catString(fURIText, getScheme());
        outPtr += XMLString::stringLen(fURIText);
        *outPtr++ = chColon;
    }

    // Authority
    if (fHost || fRegAuth)
    {
        *outPtr++ = chForwardSlash;
        *outPtr++ = chForwardSlash;

        // Server based authority.
        if (fHost)
        {
            if (fUserInfo)
            {
                XMLString::copyString(outPtr, fUserInfo);
                outPtr += XMLString::stringLen(fUserInfo);
                *outPtr++ = chAt;
            }

            XMLString::copyString(outPtr, fHost);
            outPtr += XMLString::stringLen(fHost);

            //
            //  If the port is -1, then we don't put it in. Else we need
            //  to because it was explicitly provided.
            //
            if (fPort != -1)
            {
                *outPtr++ = chColon;

                XMLCh tmpBuf[17];
                XMLString::binToText(fPort, tmpBuf, 16, 10, fMemoryManager);
                XMLString::copyString(outPtr, tmpBuf);
                outPtr += XMLString::stringLen(tmpBuf);
            }
        }
        // Registry based authority.
        else {
            XMLString::copyString(outPtr, fRegAuth);
            outPtr += XMLString::stringLen(fRegAuth);
        }
    }

    if (fPath)
    {
        XMLString::copyString(outPtr, fPath);
        outPtr += XMLString::stringLen(fPath);
    }

    if (fQueryString)
    {
        *outPtr++ = chQuestion;
        XMLString::copyString(outPtr, fQueryString);
        outPtr += XMLString::stringLen(fQueryString);
    }

    if (fFragment)
    {
        *outPtr++ = chPound;
        XMLString::copyString(outPtr, fFragment);
        outPtr += XMLString::stringLen(fFragment);
    }

    // Cap it off in case the last op was not a string copy
    *outPtr = 0;
}